

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

bool __thiscall
Memory::Recycler::ProcessObjectBeforeCollectCallbacks(Recycler *this,bool atShutdown)

{
  void *candidate;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  BOOL BVar4;
  SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
  *pSVar5;
  Type *pTVar6;
  SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
  **ppSVar7;
  undefined8 *in_FS_OFFSET;
  OutOfMemoryException anon_var_0;
  AutoNestedHandledExceptionType local_9c;
  SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
  *pSStack_98;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  ObjectBeforeCollectCallbackList *tmp;
  void *object;
  bool remove;
  ObjectBeforeCollectCallbackData *data;
  EditingIterator iter;
  bool hasRemainingCallbacks;
  undefined1 local_50 [8];
  AutoAllocatorObjectPtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>,_Memory::ArenaAllocator>
  oldCallbackList;
  undefined1 local_38 [8];
  AutoRestoreValue<Memory::Recycler::ObjectBeforeCollectCallbackState>
  autoInObjectBeforeCollectCallback;
  bool atShutdown_local;
  Recycler *this_local;
  
  if (this->objectBeforeCollectCallbackList == (ObjectBeforeCollectCallbackList *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    autoInObjectBeforeCollectCallback._23_1_ = atShutdown;
    if ((!atShutdown) && (BVar4 = IsMarkState(this), BVar4 == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x2345,"(atShutdown || this->IsMarkState())",
                         "atShutdown || this->IsMarkState()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    bVar2 = IsInObjectBeforeCollectCallback(this);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x2347,"(!this->IsInObjectBeforeCollectCallback())",
                         "!this->IsInObjectBeforeCollectCallback()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    oldCallbackList.m_allocator._4_4_ = ((byte)autoInObjectBeforeCollectCallback._23_1_ & 1) + 1;
    AutoRestoreValue<Memory::Recycler::ObjectBeforeCollectCallbackState>::AutoRestoreValue
              ((AutoRestoreValue<Memory::Recycler::ObjectBeforeCollectCallbackState> *)local_38,
               &this->objectBeforeCollectCallbackState,
               (ObjectBeforeCollectCallbackState *)((long)&oldCallbackList.m_allocator + 4));
    AutoAllocatorObjectPtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>,_Memory::ArenaAllocator>
    ::AutoAllocatorObjectPtr
              ((AutoAllocatorObjectPtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>,_Memory::ArenaAllocator>
                *)local_50,this->objectBeforeCollectCallbackList,
               &this->objectBeforeCollectCallbackArena);
    this->objectBeforeCollectCallbackList = (ObjectBeforeCollectCallbackList *)0x0;
    iter.super_EditingIterator.last._3_1_ = 0;
    pSVar5 = BasePtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>_>
             ::operator->((BasePtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>_>
                           *)local_50);
    SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>::
    GetEditingIterator((EditingIterator *)&data,pSVar5);
    while (bVar2 = SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
                   ::EditingIterator::Next((EditingIterator *)&data), bVar2) {
      pTVar6 = SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
               ::Iterator::Data((Iterator *)&data);
      bVar2 = true;
      if (pTVar6->callback != (ObjectBeforeCollectCallback)0x0) {
        candidate = pTVar6->object;
        if (((autoInObjectBeforeCollectCallback._23_1_ & 1) == 0) &&
           (bVar3 = IsObjectMarked(this,candidate), bVar3)) {
          iter.super_EditingIterator.last._3_1_ = 1;
          bVar2 = false;
        }
        else if (pTVar6->callbackWrapper == (ObjectBeforeCollectCallbackWrapper)0x0) {
          (*pTVar6->callback)(candidate,pTVar6->callbackState);
        }
        else {
          (*pTVar6->callbackWrapper)
                    (pTVar6->callback,candidate,pTVar6->callbackState,pTVar6->threadContext);
        }
      }
      if (bVar2) {
        SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
        ::EditingIterator::RemoveCurrent((EditingIterator *)&data);
      }
    }
    if ((iter.super_EditingIterator.last._3_1_ & 1) != 0) {
      if (this->objectBeforeCollectCallbackList == (ObjectBeforeCollectCallbackList *)0x0) {
        pSVar5 = BasePtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>_>
                 ::Detach((BasePtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>_>
                           *)local_50);
        this->objectBeforeCollectCallbackList = pSVar5;
      }
      else {
        pSStack_98 = BasePtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>_>
                     ::Detach((BasePtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>_>
                               *)local_50);
        pSVar5 = this->objectBeforeCollectCallbackList;
        ppSVar7 = BasePtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>_>
                  ::operator&((BasePtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>_>
                               *)local_50);
        *ppSVar7 = pSVar5;
        this->objectBeforeCollectCallbackList = pSStack_98;
        AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                  (&local_9c,ExceptionType_OutOfMemory);
        pSVar5 = BasePtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>_>
                 ::operator->((BasePtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>_>
                               *)local_50);
        SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,Memory::ArenaAllocator,RealCount>
        ::Map<Memory::Recycler::ProcessObjectBeforeCollectCallbacks(bool)::__0>
                  ((SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,Memory::ArenaAllocator,RealCount>
                    *)pSVar5,(anon_class_8_1_8991fb9c_for_fn)this);
        AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_9c);
      }
    }
    this_local._7_1_ = true;
    AutoAllocatorObjectPtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>,_Memory::ArenaAllocator>
    ::~AutoAllocatorObjectPtr
              ((AutoAllocatorObjectPtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>,_Memory::ArenaAllocator>
                *)local_50);
    AutoRestoreValue<Memory::Recycler::ObjectBeforeCollectCallbackState>::~AutoRestoreValue
              ((AutoRestoreValue<Memory::Recycler::ObjectBeforeCollectCallbackState> *)local_38);
  }
  return this_local._7_1_;
}

Assistant:

bool Recycler::ProcessObjectBeforeCollectCallbacks(bool atShutdown/*= false*/)
{
    if (this->objectBeforeCollectCallbackList == nullptr)
    {
        return false; // no callbacks
    }
    Assert(atShutdown || this->IsMarkState());

    Assert(!this->IsInObjectBeforeCollectCallback());
    AutoRestoreValue<ObjectBeforeCollectCallbackState> autoInObjectBeforeCollectCallback(&objectBeforeCollectCallbackState,
        atShutdown ? ObjectBeforeCollectCallback_Shutdown : ObjectBeforeCollectCallback_Normal);

    // The callbacks may register/unregister callbacks while we are enumerating the current map. To avoid
    // conflicting usage of the callback map, we swap it out. New registration will go to a new map.
    AutoAllocatorObjectPtr<ObjectBeforeCollectCallbackList, ArenaAllocator> oldCallbackList(
        this->objectBeforeCollectCallbackList, &this->objectBeforeCollectCallbackArena);
    this->objectBeforeCollectCallbackList = nullptr;

    bool hasRemainingCallbacks = false;
    FOREACH_SLIST_ENTRY_EDITING(ObjectBeforeCollectCallbackData, data, oldCallbackList, iter)
    {
        bool remove = true;
        if (data.callback != nullptr)
        {
            void* object = data.object;
            if (atShutdown || !this->IsObjectMarked(object))
            {
                if (data.callbackWrapper != nullptr)
                {
                    data.callbackWrapper(data.callback, object, data.callbackState, data.threadContext);
                }
                else
                {
                    data.callback(object, data.callbackState);
                }
            }
            else
            {
                hasRemainingCallbacks = true;
                remove = false; // Do not remove this entry, remaining callback for future
            }
        }
        if (remove)
        {
            iter.RemoveCurrent();
        }
    } NEXT_SLIST_ENTRY_EDITING;

    // Merge back remaining callbacks if any
    if (hasRemainingCallbacks)
    {
        if (this->objectBeforeCollectCallbackList == nullptr)
        {
            this->objectBeforeCollectCallbackList = oldCallbackList.Detach();
        }
        else
        {
            // Swap back, since old list is likely larger
            ObjectBeforeCollectCallbackList* tmp = oldCallbackList.Detach();
            *&oldCallbackList = this->objectBeforeCollectCallbackList;
            this->objectBeforeCollectCallbackList = tmp;

            try
            {
                AUTO_NESTED_HANDLED_EXCEPTION_TYPE(ExceptionType_OutOfMemory);
                oldCallbackList->Map([&](const ObjectBeforeCollectCallbackData& data)
                {
                    this->objectBeforeCollectCallbackList->Push(data);
                });
            }
            catch (Js::OutOfMemoryException)
            {
                // can't recover from OOM here
                AssertOrFailFast(UNREACHED);
            }
        }
    }

    return true; // maybe called callbacks
}